

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O0

int __thiscall
soplex::SPxScaler<double>::computeScaleExp
          (SPxScaler<double> *this,SVectorBase<double> *vec,DataArray<int> *oldScaleExp)

{
  int iVar1;
  char *pcVar2;
  element_type *this_00;
  int __c;
  DataArray<int> *in_RDX;
  SVectorBase<double> *in_RSI;
  Real RVar3;
  double a;
  int scaleExp;
  double x;
  int i;
  double maxi;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  undefined7 in_stack_ffffffffffffff60;
  byte in_stack_ffffffffffffff67;
  int local_58;
  uint local_2c;
  double local_28;
  int local_4;
  
  local_28 = 0.0;
  for (local_2c = 0; iVar1 = SVectorBase<double>::size(in_RSI), (int)local_2c < iVar1;
      local_2c = local_2c + 1) {
    SVectorBase<double>::value(in_RSI,local_2c);
    pcVar2 = SVectorBase<double>::index(in_RSI,(char *)(ulong)local_2c,__c);
    DataArray<int>::operator[](in_RDX,(int)pcVar2);
    RVar3 = spxLdexp((Real)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                     in_stack_ffffffffffffff5c);
    a = spxAbs<double>(RVar3);
    tolerances((SPxScaler<double> *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2d1299);
    RVar3 = Tolerances::epsilon(this_00);
    in_stack_ffffffffffffff67 = GT<double,double,double>(a,local_28,RVar3);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2d12ce);
    if ((in_stack_ffffffffffffff67 & 1) == 0) {
      a = local_28;
    }
    local_28 = a;
  }
  if ((local_28 != 0.0) || (NAN(local_28))) {
    spxFrexp((Real)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
             (int *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    local_4 = local_58 + -1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int SPxScaler<R>::computeScaleExp(const SVectorBase<R>& vec,
                                  const DataArray<int>& oldScaleExp) const
{
   R maxi = 0.0;

   // find largest absolute value after applying existing scaling factors
   for(int i = 0; i < vec.size(); ++i)
   {
      R x = spxAbs(spxLdexp(vec.value(i), oldScaleExp[vec.index(i)]));

      if(GT(x, maxi, this->tolerances()->epsilon()))
         maxi = x;
   }

   // empty rows/cols are possible
   if(maxi == 0.0)
      return 0;
   // get exponent corresponding to new scaling factor
   else
   {
      int scaleExp;
      spxFrexp(R(1.0 / maxi), &(scaleExp));
      return scaleExp - 1;
   }
}